

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_monte_carlo.cpp
# Opt level: O3

double triangle01_monomial_integral(int *e)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  
  if ((-1 < *e) && (-1 < e[1])) {
    lVar5 = 0;
    iVar3 = 0;
    dVar8 = 1.0;
    bVar2 = true;
    do {
      bVar4 = bVar2;
      iVar1 = e[lVar5];
      if (0 < iVar1) {
        dVar9 = 1.0;
        iVar7 = iVar1;
        iVar6 = iVar3;
        do {
          iVar6 = iVar6 + 1;
          dVar8 = (dVar8 * dVar9) / (double)iVar6;
          dVar9 = dVar9 + 1.0;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        iVar3 = iVar3 + iVar1;
      }
      lVar5 = 1;
      bVar2 = false;
    } while (bVar4);
    return (dVar8 / (double)(iVar3 + 1)) / (double)(iVar3 + 2);
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"TRIANGLE01_MONOMIAL_INTEGRAL - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  All exponents must be nonnegative.\n");
  exit(1);
}

Assistant:

double triangle01_monomial_integral ( int e[] )

//****************************************************************************80
//
//  Purpose:
//
//    TRIANGLE01_MONOMIAL_INTEGRAL: monomial integrals in the unit triangle in 2D.
//
//  Discussion:
//
//    The monomial is F(X,Y) = X^E(1) * Y^E(2).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    13 January 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int E[2], the exponents.  
//    Each exponent must be nonnegative.
//
//    Output, double TRIANGLE01_MONOMIAL_INTEGRAL, the integral.
//
{
  int i;
  double integral;
  int j;
  int k;
  const int m = 2;

  for ( i = 0; i < m; i++ )
  {
    if ( e[i] < 0 )
    {
      std::cerr << "\n";
      std::cerr << "TRIANGLE01_MONOMIAL_INTEGRAL - Fatal error!\n";
      std::cerr << "  All exponents must be nonnegative.\n";
      exit ( 1 );
    }
  }

  k = 0;
  integral = 1.0;

  for ( i = 0; i < m; i++ )
  {
    for ( j = 1; j <= e[i]; j++ )
    {
      k = k + 1;
      integral = integral * double( j ) / double( k );
    }
  }

  for ( i = 0; i < m; i++ )
  {
    k = k + 1;
    integral = integral / double( k );
  }

  return integral;
}